

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

int lyd_defaults_add_unres
              (lyd_node **root,int options,ly_ctx *ctx,lyd_node *data_tree,lyd_node *act_notif,
              unres_data *unres)

{
  LYS_NODE LVar1;
  long lVar2;
  int iVar3;
  LY_ERR *pLVar4;
  lyd_node **pplVar5;
  long lVar6;
  lys_node **pplVar7;
  lys_node *plVar8;
  lyd_node *plVar9;
  lyd_node *plVar10;
  char *format;
  lyd_node *plVar11;
  lyd_node *plVar12;
  lyd_node *second;
  uint uVar13;
  lyd_node *plVar14;
  bool bVar15;
  lyd_node *local_58;
  lyd_node *act_notif_local;
  lyd_node **local_48;
  lyd_node *local_40;
  uint local_38;
  char local_31;
  
  local_58 = act_notif;
  if (((((uint)options >> 8 & 1) != 0) || (root == (lyd_node **)0x0)) ||
     (unres == (unres_data *)0x0)) {
    __assert_fail("root && unres && !(options & LYD_OPT_ACT_NOTIF)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x1872,
                  "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lyd_node *, struct lyd_node *, struct unres_data *)"
                 );
  }
  if ((data_tree != (lyd_node *)0x0) && (data_tree->prev->next != (lyd_node *)0x0)) {
    __assert_fail("!data_tree || !data_tree->prev->next",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x1873,
                  "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lyd_node *, struct lyd_node *, struct unres_data *)"
                 );
  }
  if ((((uint)options >> 0xc & 1) != 0) && (*root == (lyd_node *)0x0)) {
    pLVar4 = ly_errno_location();
    *pLVar4 = LY_EINVAL;
    format = "Cannot add default values for one module (LYD_OPT_NOSIBLINGS) without any data.";
    goto LAB_0015b796;
  }
  plVar11 = *root;
  if ((options & 0x70U) == 0) {
    if (plVar11 != (lyd_node *)0x0) {
      if (plVar11->parent != (lyd_node *)0x0) {
        ctx = (ly_ctx *)0x0;
        options = options | 0x1000;
      }
    }
  }
  else {
    if (plVar11 == (lyd_node *)0x0) {
      pLVar4 = ly_errno_location();
      *pLVar4 = LY_EINVAL;
      format = 
      "Cannot add default values to RPC, RPC reply, and notification without at least the empty container."
      ;
      goto LAB_0015b796;
    }
    if ((act_notif == (lyd_node *)0x0 && (options & 0x10U) != 0) &&
       (plVar11->schema->nodetype != LYS_RPC)) {
      pLVar4 = ly_errno_location();
      *pLVar4 = LY_EINVAL;
      format = "Not valid RPC/action data.";
      goto LAB_0015b796;
    }
    if (((options & 0x20U) != 0 && act_notif == (lyd_node *)0x0) &&
       (plVar11->schema->nodetype != LYS_RPC)) {
      pLVar4 = ly_errno_location();
      *pLVar4 = LY_EINVAL;
      format = "Not valid reply data.";
      goto LAB_0015b796;
    }
    if (((options & 0x40U) != 0 && act_notif == (lyd_node *)0x0) &&
       (plVar11->schema->nodetype != LYS_NOTIF)) {
      pLVar4 = ly_errno_location();
      *pLVar4 = LY_EINVAL;
      format = "Not valid notification data.";
      goto LAB_0015b796;
    }
  }
  act_notif_local = data_tree;
  pplVar5 = &local_58;
  if (act_notif == (lyd_node *)0x0) {
    pplVar5 = root;
  }
  if (((uint)options >> 8 & 1) != 0) {
    __assert_fail("root && !(options & LYD_OPT_ACT_NOTIF)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x1829,
                  "int lyd_wd_add(struct lyd_node **, struct ly_ctx *, struct unres_data *, int)");
  }
  plVar11 = *pplVar5;
  if (ctx == (ly_ctx *)0x0 && plVar11 == (lyd_node *)0x0) {
    __assert_fail("*root || ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x182a,
                  "int lyd_wd_add(struct lyd_node **, struct ly_ctx *, struct unres_data *, int)");
  }
  if (((uint)options >> 0xc & 1) != 0 && plVar11 == (lyd_node *)0x0) {
    __assert_fail("!(options & LYD_OPT_NOSIBLINGS) || *root",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x182b,
                  "int lyd_wd_add(struct lyd_node **, struct ly_ctx *, struct unres_data *, int)");
  }
  local_38 = options;
  if ((options & 0xeU) == 0) {
    if (ctx == (ly_ctx *)0x0) {
      ctx = plVar11->schema->module->ctx;
    }
    if ((options & 0xf1U) == 0 || (options & 1U) != 0) {
      if (((uint)options >> 0xc & 1) == 0) {
        lVar2 = 0;
        while (lVar6 = lVar2, local_48 = root, lVar6 < (ctx->models).used) {
          local_40 = (lyd_node *)lVar6;
          lVar2 = lVar6 + 1;
        }
      }
      else {
        plVar8 = plVar11->schema;
        plVar11 = (lyd_node *)0x0;
        iVar3 = 1;
LAB_0015b71b:
        iVar3 = lyd_wd_add_subtree(pplVar5,plVar11,plVar11,plVar8,iVar3,options,unres);
        if (iVar3 != 0) {
          return 1;
        }
      }
    }
    else {
      if ((options & 0x40U) != 0) {
        if ((plVar11 == (lyd_node *)0x0) ||
           (plVar8 = plVar11->schema, plVar8->nodetype != LYS_NOTIF)) {
          pLVar4 = ly_errno_location();
          *pLVar4 = LY_EINVAL;
          format = "Subtree is not a single notification.";
          goto LAB_0015b796;
        }
        iVar3 = 0;
        goto LAB_0015b71b;
      }
      if ((options & 0x30U) == 0) {
        pLVar4 = ly_errno_location();
        *pLVar4 = LY_EINT;
        ly_log(LY_LLERR,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
               ,0x1864);
        return 1;
      }
      if ((plVar11 == (lyd_node *)0x0) ||
         ((plVar11->schema->nodetype & (LYS_ACTION|LYS_RPC)) == LYS_UNKNOWN)) {
        pLVar4 = ly_errno_location();
        *pLVar4 = LY_EINVAL;
        format = "Subtree is not a single RPC/action/reply.";
LAB_0015b796:
        ly_log(LY_LLERR,format);
        return 1;
      }
      pplVar7 = &plVar11->schema->child;
      if ((options & 0x10U) == 0) {
        while (plVar8 = *pplVar7, plVar8 != (lys_node *)0x0) {
          if (plVar8->nodetype == LYS_OUTPUT) goto LAB_0015b7da;
          pplVar7 = &plVar8->next;
        }
      }
      else {
        while (plVar8 = *pplVar7, plVar8 != (lys_node *)0x0) {
          if (plVar8->nodetype == LYS_INPUT) goto LAB_0015b7da;
          pplVar7 = &plVar8->next;
        }
      }
    }
  }
LAB_0015b3fe:
  if (unres->count == 0) {
    return 0;
  }
  plVar11 = *root;
  if (plVar11 == (lyd_node *)0x0) {
    pLVar4 = ly_errno_location();
    *pLVar4 = LY_EINT;
    ly_log(LY_LLERR,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
           ,0x189b);
    return 1;
  }
  bVar15 = (local_38 & 0x70) == 0;
  local_31 = bVar15 || act_notif_local == (lyd_node *)0x0;
  if (bVar15 || act_notif_local == (lyd_node *)0x0) {
    plVar11 = (lyd_node *)0x0;
    local_40 = (lyd_node *)0x0;
    plVar12 = (lyd_node *)0x0;
    local_48 = root;
  }
  else {
    plVar12 = act_notif_local;
    if (local_58 != (lyd_node *)0x0) {
      if (local_58->parent == (lyd_node *)0x0) {
        local_48 = root;
        __assert_fail("act_notif->parent",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                      ,0x18a3,
                      "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lyd_node *, struct lyd_node *, struct unres_data *)"
                     );
      }
      local_48 = root;
      plVar14 = (lyd_node *)0x0;
      plVar10 = (lyd_node *)0x0;
LAB_0015b626:
      while (second = plVar11, local_40 = plVar14, plVar9 = plVar12, plVar11 = second,
            plVar9 != (lyd_node *)0x0) {
        for (; plVar9 != (lyd_node *)0x0; plVar9 = plVar9->next) {
          if ((plVar9->schema == second->schema) &&
             ((second->schema->nodetype != LYS_LIST ||
              (iVar3 = lyd_list_equal(plVar9,second,0,0,0), iVar3 != 0)))) {
            plVar12 = plVar9->child;
            plVar14 = second->child;
            if (second->child != (lyd_node *)0x0) goto LAB_0015b674;
            pLVar4 = ly_errno_location();
            *pLVar4 = LY_EINT;
            ly_log(LY_LLERR,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                   ,0x18bc);
            uVar13 = 1;
            goto LAB_0015b8a0;
          }
        }
        plVar14 = local_40;
        plVar12 = (lyd_node *)0x0;
      }
      plVar14 = (lyd_node *)0x0;
      second = local_40;
      goto LAB_0015b80b;
    }
    local_40 = (lyd_node *)0x0;
    plVar10 = (lyd_node *)0x0;
    local_48 = root;
LAB_0015b81d:
    lyd_unlink_internal(plVar11,0);
    if (plVar10 == (lyd_node *)0x0 && plVar12 == (lyd_node *)0x0) {
      __assert_fail("data_tree_parent || data_tree_sibling",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                    ,0x18e1,
                    "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lyd_node *, struct lyd_node *, struct unres_data *)"
                   );
    }
    if (plVar10 != (lyd_node *)0x0) {
      plVar14 = plVar10->child;
      if (plVar14 == (lyd_node *)0x0) {
        pplVar5 = &plVar10->child;
      }
      else {
        plVar9 = plVar14->prev;
        pplVar5 = &plVar14->prev;
        plVar9->next = plVar11;
        plVar11->prev = plVar9;
      }
      *pplVar5 = plVar11;
      plVar11->parent = plVar10;
      plVar9 = plVar10;
      goto LAB_0015b885;
    }
    if (plVar12->parent != (lyd_node *)0x0) {
      __assert_fail("!data_tree_sibling->parent",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                    ,0x18ee,
                    "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lyd_node *, struct lyd_node *, struct unres_data *)"
                   );
    }
    plVar14 = plVar12->prev;
    plVar11->prev = plVar14;
    plVar14->next = plVar11;
    plVar12->prev = plVar11;
  }
  plVar9 = (lyd_node *)0x0;
LAB_0015b885:
  iVar3 = resolve_unres_data(unres,local_48,local_38);
  uVar13 = (uint)(iVar3 != 0);
LAB_0015b8a0:
  if (local_31 != '\0') {
    return uVar13;
  }
  if (plVar9 == (lyd_node *)0x0) {
    if (plVar12->prev != plVar11) {
      __assert_fail("data_tree_sibling->prev == msg_sibling",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                    ,0x1907,
                    "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lyd_node *, struct lyd_node *, struct unres_data *)"
                   );
    }
    plVar14 = plVar11->prev;
    plVar12->prev = plVar14;
    plVar14->next = (lyd_node *)0x0;
    plVar11->prev = plVar11;
  }
  else {
    if (plVar9->child->prev != plVar11) {
      __assert_fail("data_tree_parent->child->prev == msg_sibling",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                    ,0x1901,
                    "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lyd_node *, struct lyd_node *, struct unres_data *)"
                   );
    }
    plVar12 = plVar11->prev;
    plVar9->child->prev = plVar12;
    plVar12->next = (lyd_node *)0x0;
    plVar11->prev = plVar11;
    plVar11->parent = (lyd_node *)0x0;
  }
  if (local_40 != (lyd_node *)0x0) {
    plVar12 = local_40->child;
    if (plVar12 == (lyd_node *)0x0) {
      pplVar5 = &local_40->child;
    }
    else {
      plVar14 = plVar12->prev;
      pplVar5 = &plVar12->prev;
      plVar14->next = plVar11;
      plVar11->prev = plVar14;
    }
    *pplVar5 = plVar11;
    plVar11->parent = local_40;
    return uVar13;
  }
  return uVar13;
LAB_0015b7da:
  iVar3 = lyd_wd_add_subtree(pplVar5,plVar11,plVar11,plVar8,0,options,unres);
  if (iVar3 != 0) {
    return 1;
  }
  goto LAB_0015b3fe;
LAB_0015b674:
  plVar11 = plVar14;
  LVar1 = plVar11->schema->nodetype;
  if (LVar1 != LYS_LEAF) goto LAB_0015b691;
  plVar14 = plVar11->next;
  if (plVar11->next == (lyd_node *)0x0) {
    pLVar4 = ly_errno_location();
    *pLVar4 = LY_EINT;
    ly_log(LY_LLERR,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
           ,0x18c4);
    uVar13 = 1;
    local_40 = second;
    goto LAB_0015b8a0;
  }
  goto LAB_0015b674;
LAB_0015b691:
  plVar14 = second;
  plVar10 = plVar9;
  if ((LVar1 & (LYS_ACTION|LYS_NOTIF)) != LYS_UNKNOWN) goto code_r0x0015b697;
  goto LAB_0015b626;
code_r0x0015b697:
  if (local_58->parent->schema != plVar9->schema) {
    __assert_fail("act_notif->parent->schema == data_tree_parent->schema",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x18ca,
                  "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lyd_node *, struct lyd_node *, struct unres_data *)"
                 );
  }
  plVar14 = plVar12;
  if (plVar11 != local_58) {
    __assert_fail("msg_sibling == act_notif",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x18cb,
                  "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lyd_node *, struct lyd_node *, struct unres_data *)"
                 );
  }
LAB_0015b80b:
  plVar12 = act_notif_local;
  local_40 = second;
  if (plVar10 != (lyd_node *)0x0) {
    plVar12 = plVar14;
  }
  goto LAB_0015b81d;
}

Assistant:

int
lyd_defaults_add_unres(struct lyd_node **root, int options, struct ly_ctx *ctx, const struct lyd_node *data_tree,
                       struct lyd_node *act_notif, struct unres_data *unres)
{
    struct lyd_node *msg_sibling = NULL, *msg_parent = NULL, *data_tree_sibling = NULL, *data_tree_parent = NULL;
    int ret = EXIT_FAILURE;

    assert(root && unres && !(options & LYD_OPT_ACT_NOTIF));
    assert(!data_tree || !data_tree->prev->next);

    if ((options & LYD_OPT_NOSIBLINGS) && !(*root)) {
        LOGERR(LY_EINVAL, "Cannot add default values for one module (LYD_OPT_NOSIBLINGS) without any data.");
        return EXIT_FAILURE;
    }

    if (options & (LYD_OPT_RPC | LYD_OPT_RPCREPLY | LYD_OPT_NOTIF)) {
        if (!(*root)) {
            LOGERR(LY_EINVAL, "Cannot add default values to RPC, RPC reply, and notification without at least the empty container.");
            return EXIT_FAILURE;
        }
        if ((options & LYD_OPT_RPC) && !act_notif && ((*root)->schema->nodetype != LYS_RPC)) {
            LOGERR(LY_EINVAL, "Not valid RPC/action data.");
            return EXIT_FAILURE;
        }
        if ((options & LYD_OPT_RPCREPLY) && !act_notif && ((*root)->schema->nodetype != LYS_RPC)) {
            LOGERR(LY_EINVAL, "Not valid reply data.");
            return EXIT_FAILURE;
        }
        if ((options & LYD_OPT_NOTIF) && !act_notif && ((*root)->schema->nodetype != LYS_NOTIF)) {
            LOGERR(LY_EINVAL, "Not valid notification data.");
            return EXIT_FAILURE;
        }
    } else if (*root && (*root)->parent) {
        /* we have inner node, so it will be considered as
         * a root of subtree where to add default nodes and
         * no of its siblings will be affected */
        options |= LYD_OPT_NOSIBLINGS;
        ctx = NULL;
    }

    /* add missing default nodes */
    if (lyd_wd_add((act_notif ? &act_notif : root), ctx, unres, options)) {
        return EXIT_FAILURE;
    }

    /* check leafrefs and/or instids if any */
    if (unres && unres->count) {
        if (!(*root)) {
            LOGINT;
            return EXIT_FAILURE;
        }

        /* temporarily link the additional data tree to the RPC/action/notification */
        if (data_tree && (options & (LYD_OPT_RPC | LYD_OPT_RPCREPLY | LYD_OPT_NOTIF))) {
            if (act_notif) {
                /* fun case */
                assert(act_notif->parent);

                msg_parent = NULL;
                msg_sibling = *root;
                data_tree_parent = NULL;
                data_tree_sibling = (struct lyd_node *)data_tree;
                while (data_tree_sibling) {
                    while (data_tree_sibling) {
                        if ((data_tree_sibling->schema == msg_sibling->schema)
                                && ((msg_sibling->schema->nodetype != LYS_LIST)
                                    || lyd_list_equal(data_tree_sibling, msg_sibling, 0, 0, 0))) {
                            /* match */
                            break;
                        }

                        data_tree_sibling = data_tree_sibling->next;
                    }

                    if (data_tree_sibling) {
                        /* prepare for the new data_tree iteration */
                        data_tree_parent = data_tree_sibling;
                        data_tree_sibling = data_tree_sibling->child;

                        /* find new action sibling to search for later (skip list keys) */
                        if (!msg_sibling->child) {
                            LOGINT;
                            goto unlink_datatree;
                        }
                        msg_parent = msg_sibling;
                        for (msg_sibling = msg_sibling->child;
                                msg_sibling->schema->nodetype == LYS_LEAF;
                                msg_sibling = msg_sibling->next) {
                            if (!msg_sibling->next) {
                                LOGINT;
                                goto unlink_datatree;
                            }
                        }
                        if (msg_sibling->schema->nodetype & (LYS_ACTION | LYS_NOTIF)) {
                            /* we are done */
                            assert(act_notif->parent->schema == data_tree_parent->schema);
                            assert(msg_sibling == act_notif);
                            break;
                        }
                    }
                }

                /* loop ended after the first iteration, set the values correctly */
                if (!data_tree_parent) {
                    data_tree_sibling = (struct lyd_node *)data_tree;
                }

            } else {
                /* easy case */
                data_tree_parent = NULL;
                msg_sibling = *root;
                data_tree_sibling = (struct lyd_node *)data_tree;
            }

            /* unlink msg_sibling if needed (won't do anything otherwise) */
            lyd_unlink_internal(msg_sibling, 0);

            /* now we can link msg_sibling into data_tree_parent or next to data_tree_sibling */
            assert(data_tree_parent || data_tree_sibling);
            if (data_tree_parent) {
                if (!data_tree_parent->child) {
                    data_tree_parent->child = msg_sibling;
                } else {
                    /* last child of data_tree_parent */
                    data_tree_parent->child->prev->next = msg_sibling;
                    msg_sibling->prev = data_tree_parent->child->prev;
                    data_tree_parent->child->prev = msg_sibling;
                }
                msg_sibling->parent = data_tree_parent;
            } else {
                /* last sibling of data_tree_sibling */
                assert(!data_tree_sibling->parent);
                msg_sibling->prev = data_tree_sibling->prev;
                data_tree_sibling->prev->next = msg_sibling;
                data_tree_sibling->prev = msg_sibling;
            }
        }

        if (resolve_unres_data(unres, root, options)) {
            goto unlink_datatree;
        }

        /* we are done */
        ret = EXIT_SUCCESS;

unlink_datatree:
        /* put the trees back in order */
        if (data_tree && (options & (LYD_OPT_RPC | LYD_OPT_RPCREPLY | LYD_OPT_NOTIF))) {
            /* unlink it back */
            if (data_tree_parent) {
                assert(data_tree_parent->child->prev == msg_sibling);
                data_tree_parent->child->prev = msg_sibling->prev;
                data_tree_parent->child->prev->next = NULL;
                msg_sibling->prev = msg_sibling;
                msg_sibling->parent = NULL;
            } else {
                assert(data_tree_sibling->prev == msg_sibling);
                data_tree_sibling->prev = msg_sibling->prev;
                data_tree_sibling->prev->next = NULL;
                msg_sibling->prev = msg_sibling;
            }

            /* link it back, if there is a parent to link to */
            if (msg_parent) {
                /* it must always be last */
                if (!msg_parent->child) {
                    msg_parent->child = msg_sibling;
                } else {
                    msg_parent->child->prev->next = msg_sibling;
                    msg_sibling->prev = msg_parent->child->prev;
                    msg_parent->child->prev = msg_sibling;
                }
                msg_sibling->parent = msg_parent;
            }
        }
    } else {
        /* we are done */
        ret = EXIT_SUCCESS;
    }

    return ret;
}